

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O1

CMutableTransaction *
BuildCreditingTransaction
          (CMutableTransaction *__return_storage_ptr__,CScript *scriptPubKey,int nValue)

{
  uchar *puVar1;
  pointer pCVar2;
  CScript *this;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  CScriptNum local_58;
  CScriptNum local_50;
  undefined1 local_48 [28];
  uint uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  __return_storage_ptr__->version = 1;
  __return_storage_ptr__->nLockTime = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&__return_storage_ptr__->vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&__return_storage_ptr__->vout,1);
  pCVar2 = (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 0x10);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 0x18);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(undefined8 *)&(pCVar2->prevout).hash = 0;
  puVar1 = (uchar *)((long)&(pCVar2->prevout).hash + 8);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  (pCVar2->prevout).n = 0xffffffff;
  local_48._16_8_ = 0;
  stack0xffffffffffffffd0 = 0;
  local_48._0_8_ = (char *)0x0;
  local_48._8_8_ = 0;
  local_50.m_value = 0;
  this = CScript::operator<<((CScript *)local_48,&local_50);
  local_58.m_value = 0;
  other = &CScript::operator<<(this,&local_58)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                _M_impl.super__Vector_impl_data._M_start)->scriptSig).super_CScriptBase,other);
  if (0x1c < uStack_2c) {
    free((void *)local_48._0_8_);
    local_48._0_8_ = (char *)0x0;
  }
  ((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
   super__Vector_impl_data._M_start)->nSequence = 0xffffffff;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(((__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             &scriptPubKey->super_CScriptBase);
  ((__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue = (long)nValue;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction BuildCreditingTransaction(const CScript& scriptPubKey, int nValue)
{
    CMutableTransaction txCredit;
    txCredit.version = 1;
    txCredit.nLockTime = 0;
    txCredit.vin.resize(1);
    txCredit.vout.resize(1);
    txCredit.vin[0].prevout.SetNull();
    txCredit.vin[0].scriptSig = CScript() << CScriptNum(0) << CScriptNum(0);
    txCredit.vin[0].nSequence = CTxIn::SEQUENCE_FINAL;
    txCredit.vout[0].scriptPubKey = scriptPubKey;
    txCredit.vout[0].nValue = nValue;

    return txCredit;
}